

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompiledMixedType<unsigned_int,char>(void)

{
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  uint uVar2;
  int iVar3;
  char u;
  int local_40;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_34;
  
  u = '\0';
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<char>
            (&local_34,&u);
  su.m_int = u;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<char>
            (&st2,&su);
  local_34.m_int = 0;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_34
             ,&u);
  SafeCastHelper<unsigned_int,_char,_1>::
  CastThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(su.m_int,(uint *)&local_34);
  local_34.m_int = st2.m_int;
  SafeInt::operator_cast_to_char((SafeInt *)&local_34);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_34
             ,u);
  if ((int)((ulong)local_34.m_int * (ulong)st2.m_int >> 0x20) == 0) {
    operator*(u,local_34);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_34,u);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_34,su);
    u = '\x01';
    iVar3 = 1;
    local_40 = iVar3;
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_34,&local_40);
    local_40 = iVar3;
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,&local_40);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_34,u);
    local_40 = iVar3;
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
               &local_40);
    SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
              (&local_34,st2);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_34,u);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_34,su);
    u = '\x01';
    local_40 = iVar3;
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
               &local_40);
    local_40 = iVar3;
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_34,&local_40);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_34,u);
    SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
              (&local_34,st2);
    operator/(u,local_34);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_34,u);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_34,su);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_34,u);
    SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
              (&local_34,st2);
    operator+(u,local_34);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_34,u);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_34,su);
    local_40 = 0;
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_34,&local_40);
    u = '\0';
    local_40 = 0;
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
               &local_40);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_34,u);
    SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
              (&local_34,st2);
    operator-(u,local_34);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_34,u);
    local_40 = iVar3;
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_34,&local_40);
    local_40 = iVar3;
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,&local_40);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_34,su);
    u = '\x01';
    local_40 = iVar3;
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&su,&local_40);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_34,u);
    SVar1 = SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                      ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )&local_34,su);
    operator<<(SVar1.m_int,su);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_34,u);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_34,su);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_34,u);
    SVar1 = SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                      ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )&local_34,su);
    operator>>(SVar1.m_int,su);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_34,u);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_34,su);
    uVar2 = BinaryAndHelper<unsigned_int,_char,_1>::And(local_34.m_int,u);
    local_40._0_1_ = (SafeInt)((byte)uVar2 & su.m_int);
    SafeInt::operator_cast_to_unsigned_int((SafeInt *)&local_40);
    local_34.m_int = local_34.m_int & st2.m_int;
    local_34.m_int = BinaryAndHelper<unsigned_int,_char,_1>::And(local_34.m_int,u);
    local_34.m_int = BinaryAndHelper<unsigned_int,_char,_1>::And(local_34.m_int,su.m_int);
    uVar2 = BinaryOrHelper<unsigned_int,_char,_1>::Or(local_34.m_int,u);
    local_40._0_1_ = (SafeInt)((byte)uVar2 | su.m_int);
    SafeInt::operator_cast_to_unsigned_int((SafeInt *)&local_40);
    local_34.m_int = local_34.m_int | st2.m_int;
    local_34.m_int = BinaryOrHelper<unsigned_int,_char,_1>::Or(local_34.m_int,u);
    local_34.m_int = BinaryOrHelper<unsigned_int,_char,_1>::Or(local_34.m_int,su.m_int);
    uVar2 = BinaryXorHelper<unsigned_int,_char,_1>::Xor(local_34.m_int,u);
    local_40 = CONCAT31(local_40._1_3_,(byte)uVar2 ^ su.m_int);
    SafeInt::operator_cast_to_unsigned_int((SafeInt *)&local_40);
    local_34.m_int = local_34.m_int ^ st2.m_int;
    local_34.m_int = BinaryXorHelper<unsigned_int,_char,_1>::Xor(local_34.m_int,u);
    BinaryXorHelper<unsigned_int,_char,_1>::Xor(local_34.m_int,su.m_int);
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}